

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O1

bool ON_ValidateMeshNgonUserData(ON_V4V5_MeshNgonUserData *ngud,ON_Mesh *mesh)

{
  ON_V4V5_MeshNgon *pOVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ON_V4V5_MeshNgonList *pOVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  
  pOVar5 = ngud->m_ngon_list;
  if (pOVar5 == (ON_V4V5_MeshNgonList *)0x0) {
    return false;
  }
  iVar2 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  iVar3 = (mesh->m_F).m_count;
  if ((ngud->m_mesh_V_count == 0) && (ngud->m_mesh_F_count == 0)) {
    ngud->m_mesh_F_count = -1;
    ngud->m_mesh_V_count = -1;
    uVar8 = (ulong)pOVar5->m_ngons_count;
    bVar6 = 0 < (long)uVar8;
    bVar13 = bVar6;
    if (0 < (long)uVar8) {
      uVar9 = 0;
LAB_0052df25:
      bVar7 = bVar6;
      if (pOVar5->m_ngons != (ON_V4V5_MeshNgon *)0x0) {
        pOVar1 = pOVar5->m_ngons + uVar9;
        uVar10 = (ulong)(uint)pOVar1->N;
        bVar7 = bVar13;
        if (-1 < pOVar1->N) {
          if (uVar10 != 0) {
            uVar12 = 1;
            uVar11 = 0;
            do {
              iVar4 = pOVar1->vi[uVar11];
              bVar13 = iVar4 < iVar2 && -1 < iVar4;
              if (iVar4 >= iVar2 || -1 >= iVar4) goto LAB_0052dfb3;
              iVar4 = pOVar1->fi[uVar11];
              if ((iVar4 < 0) || (iVar3 <= iVar4)) goto joined_r0x0052df8e;
              uVar11 = uVar11 + 1;
              uVar12 = uVar12 + 1;
            } while (uVar10 != uVar11);
          }
          goto LAB_0052dfb8;
        }
      }
      goto LAB_0052dfda;
    }
LAB_0052dfce:
    ngud->m_mesh_V_count = iVar2;
    ngud->m_mesh_F_count = iVar3;
    bVar7 = bVar13;
LAB_0052dfda:
    if (bVar7) {
      return false;
    }
  }
  if (ngud->m_mesh_F_count != iVar3) {
    return false;
  }
  return ngud->m_mesh_V_count == iVar2;
joined_r0x0052df8e:
  if (iVar4 != -1) goto LAB_0052dfda;
  bVar13 = uVar10 <= uVar12;
  if (bVar13) goto LAB_0052dfb3;
  iVar4 = pOVar1->vi[uVar12];
  if ((iVar4 < 0) || (iVar2 <= iVar4)) goto LAB_0052dfda;
  iVar4 = pOVar1->fi[uVar12];
  uVar12 = uVar12 + 1;
  goto joined_r0x0052df8e;
LAB_0052dfb3:
  if (!bVar13) goto LAB_0052dfda;
LAB_0052dfb8:
  uVar9 = uVar9 + 1;
  bVar13 = uVar9 < uVar8;
  if (uVar9 == uVar8) goto LAB_0052dfce;
  goto LAB_0052df25;
}

Assistant:

static 
bool ON_ValidateMeshNgonUserData(
  ON_V4V5_MeshNgonUserData* ngud,
  const ON_Mesh& mesh
  )
{
  int i;
  if ( 0 == ngud || 0 == ngud->m_ngon_list )
    return false;

  const int mesh_V_count = mesh.m_V.Count();
  const int mesh_F_count = mesh.m_F.Count();

  if ( 0 == ngud->m_mesh_V_count && 0 == ngud->m_mesh_F_count )
  {
    // This is old user data that did not have validation counts
    // saved in the file.

    // Set validation counts to -1 so we never do this slow validation again.
    ngud->m_mesh_V_count = -1;
    ngud->m_mesh_F_count = -1;

    const int ngon_count = ngud->m_ngon_list->V4V5_NgonCount();

    for ( i = 0; i < ngon_count; i++ )
    {
      if ( !ON_ValidateNgon(ngud->m_ngon_list->V4V5_Ngon(i),mesh_V_count,mesh_F_count) )
        return false;
    }

    // Set validation counts to proper values because we will 
    // assume this old ngon information is valid since the indices
    // are in range.  This assumption may not be valid, but
    // at least the ngon won't cause a crash.
    ngud->m_mesh_V_count = mesh_V_count;
    ngud->m_mesh_F_count = mesh_F_count;
  }

  return ( ngud->m_mesh_F_count == mesh_F_count && ngud->m_mesh_V_count == mesh_V_count );
}